

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_8x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [16];
  int y_mask;
  uint uVar15;
  short sVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar21 [16];
  ushort uVar34;
  ushort uVar35;
  
  auVar14 = _DAT_004688a0;
  auVar16 = pshuflw(ZEXT116(left_column[7]),ZEXT116(left_column[7]),0);
  sVar17 = auVar16._2_2_;
  auVar16._2_2_ = sVar17 * 0x3b;
  auVar16._4_2_ = auVar16._0_2_ * 0x6e;
  auVar16._6_2_ = sVar17 * 0x97;
  auVar16._8_2_ = auVar16._0_2_ * 0xb7;
  auVar16._10_2_ = sVar17 * 0xce;
  auVar16._12_2_ = auVar16._0_2_ * 0xdb;
  auVar16._14_2_ = sVar17 * 0xe0;
  uVar1 = *(ulong *)top_row;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = (char)(uVar1 >> 8);
  for (uVar15 = 0x1000100; uVar15 < 0xf0e0f0f; uVar15 = uVar15 + 0x2020202) {
    auVar21._4_4_ = uVar15;
    auVar21._0_4_ = uVar15;
    auVar21._8_4_ = uVar15;
    auVar21._12_4_ = uVar15;
    auVar18 = pshufb(auVar14,auVar21);
    auVar21 = pshufb(auVar16,auVar21);
    uVar19 = auVar21._0_2_ + auVar18._0_2_ * (ushort)(byte)uVar1 + 0x80;
    uVar22 = auVar21._2_2_ + auVar18._2_2_ * auVar11._0_2_ + 0x80;
    uVar24 = auVar21._4_2_ + auVar18._4_2_ * auVar10._0_2_ + 0x80;
    uVar26 = auVar21._6_2_ + auVar18._6_2_ * (short)Var9 + 0x80;
    uVar28 = auVar21._8_2_ + auVar18._8_2_ * auVar7._8_2_ + 0x80;
    uVar30 = auVar21._10_2_ + auVar18._10_2_ * auVar5._10_2_ + 0x80;
    uVar32 = auVar21._12_2_ + auVar18._12_2_ * auVar3._12_2_ + 0x80;
    uVar34 = auVar21._14_2_ + auVar18._14_2_ * (auVar2._13_2_ >> 8) + 0x80;
    uVar20 = uVar19 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                  CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33),
                           CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                    (0xff < uVar31),
                                    CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar25 != 0) * (uVar25 < 0x100) *
                                                               (char)(uVar24 >> 8) - (0xff < uVar25)
                                                               ,CONCAT11((uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23),
                                                                         (uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20))))))));
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_8x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}